

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_dbref(void)

{
  uint uVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  int __fd;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  void *__buf;
  void *pvVar8;
  void *__s2;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  dbref_test_t tests [4];
  bson_t b;
  bson_error_t error;
  undefined8 in_stack_fffffffffffffbd8;
  undefined4 uVar13;
  void *local_3c8;
  char *local_3c0;
  void *local_3b8;
  char *local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  undefined8 local_398;
  char *local_390;
  undefined8 local_388;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [640];
  
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
  uVar5 = bson_bcon_magic();
  if (oid_zero_initialized == '\0') {
    bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
    oid_zero_initialized = '\x01';
  }
  local_3c8 = (void *)bcon_new(0,"key","{","$ref",uVar5,0,"collection","$id",uVar5,
                               CONCAT44(uVar13,6),oid_zero_oid,"}",0);
  uVar6 = bcon_new(0,"key","{","$ref",uVar5,0,"collection","$id",uVar5,0xf,1,"}",0);
  uVar7 = bcon_new(0,"key","{","$ref",uVar5,0,"collection","$id","{","a",uVar5,0xf,1,"}","}",0);
  local_388 = bcon_new(0,"key","{","$ref",uVar5,0,"collection","$id",uVar5,0xf,1,"meta",uVar5,7,1,
                       "}",0);
  local_3c0 = 
  "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
  local_3b8 = local_3c8;
  local_3b0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
  local_3a8 = uVar6;
  local_3a0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
  local_398 = uVar7;
  local_390 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
  lVar11 = 8;
  while( true ) {
    if (lVar11 == 0x48) {
      for (lVar11 = 8; lVar11 != 0x48; lVar11 = lVar11 + 0x10) {
        bson_destroy(*(undefined8 *)((long)&local_3c0 + lVar11));
      }
      return;
    }
    cVar3 = bson_init_from_json(local_380,*(undefined8 *)((long)&local_3c8 + lVar11),
                                0xffffffffffffffff,local_2b8);
    if (cVar3 == '\0') break;
    local_3c8 = (void *)bson_get_data(local_380);
    lVar2 = *(long *)((long)&local_3c0 + lVar11);
    __buf = (void *)bson_get_data(lVar2);
    if (*(uint *)(lVar2 + 4) != local_37c) {
LAB_00124cf2:
      uVar12 = 0;
      uVar5 = bson_as_canonical_extended_json(local_380,0);
      uVar6 = bson_as_canonical_extended_json(lVar2,0);
      pvVar8 = local_3c8;
      uVar1 = *(uint *)(lVar2 + 4);
      goto LAB_00124d25;
    }
    pvVar8 = (void *)bson_get_data(lVar2);
    __s2 = (void *)bson_get_data(local_380);
    iVar4 = bcmp(pvVar8,__s2,(ulong)*(uint *)(lVar2 + 4));
    if (iVar4 != 0) goto LAB_00124cf2;
    bson_destroy(local_380);
    lVar11 = lVar11 + 0x10;
  }
  fprintf(_stderr,"%s\n",local_2b0);
  pcVar10 = "r";
  uVar5 = 0x732;
  goto LAB_00124e2e;
LAB_00124d25:
  if ((local_37c == (uint)uVar12) || (uVar1 <= (uint)uVar12)) goto LAB_00124d3e;
  if (*(char *)((long)local_3c8 + uVar12) != *(char *)((long)__buf + uVar12)) {
    uVar12 = uVar12 & 0xffffffff;
    goto LAB_00124d4a;
  }
  uVar12 = uVar12 + 1;
  goto LAB_00124d25;
LAB_00124d3e:
  uVar9 = local_37c;
  if (local_37c < uVar1) {
    uVar9 = uVar1;
  }
  uVar12 = (ulong)(uVar9 - 1);
LAB_00124d4a:
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar12,uVar5,uVar6);
  iVar4 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar4 == -1) {
    pcVar10 = "fd1 != -1";
  }
  else if (__fd == -1) {
    pcVar10 = "fd2 != -1";
  }
  else {
    uVar12 = write(iVar4,pvVar8,(ulong)local_37c);
    if (uVar12 == local_37c) {
      uVar1 = *(uint *)(lVar2 + 4);
      uVar12 = write(__fd,__buf,(ulong)uVar1);
      if (uVar12 == uVar1) {
        close(iVar4);
        close(__fd);
        pcVar10 = "0";
      }
      else {
        pcVar10 = 
        "(tests[i].expected_bson)->len == bson_write (fd2, expected_data, (tests[i].expected_bson)->len)"
        ;
      }
    }
    else {
      pcVar10 = "(&b)->len == bson_write (fd1, bson_data, (&b)->len)";
    }
  }
  uVar5 = 0x733;
LAB_00124e2e:
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar5,"test_bson_json_dbref",pcVar10);
  abort();
}

Assistant:

static void
test_bson_json_dbref (void)
{
   bson_error_t error;

   const char *json_with_objectid =
      "{ \"key\": {"
      "\"$ref\": \"collection\","
      "\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";

   bson_t *bson_with_objectid = BCON_NEW ("key",
                                          "{",
                                          "$ref",
                                          BCON_UTF8 ("collection"),
                                          "$id",
                                          BCON_OID (oid_zero ()),
                                          "}");

   const char *json_with_int_id = "{ \"key\": {"
                                  "\"$ref\": \"collection\","
                                  "\"$id\": 1}}";

   bson_t *bson_with_int_id = BCON_NEW (
      "key", "{", "$ref", BCON_UTF8 ("collection"), "$id", BCON_INT32 (1), "}");

   const char *json_with_subdoc_id = "{ \"key\": {"
                                     "\"$ref\": \"collection\","
                                     "\"$id\": {\"a\": 1}}}";

   bson_t *bson_with_subdoc_id = BCON_NEW ("key",
                                           "{",
                                           "$ref",
                                           BCON_UTF8 ("collection"),
                                           "$id",
                                           "{",
                                           "a",
                                           BCON_INT32 (1),
                                           "}",
                                           "}");

   const char *json_with_metadata = "{ \"key\": {"
                                    "\"$ref\": \"collection\","
                                    "\"$id\": 1,"
                                    "\"meta\": true}}";

   bson_t *bson_with_metadata = BCON_NEW ("key",
                                          "{",
                                          "$ref",
                                          BCON_UTF8 ("collection"),
                                          "$id",
                                          BCON_INT32 (1),
                                          "meta",
                                          BCON_BOOL (true),
                                          "}");

   bson_t b;
   bool r;

   typedef struct {
      const char *json;
      bson_t *expected_bson;
   } dbref_test_t;

   dbref_test_t tests[] = {
      {json_with_objectid, bson_with_objectid},
      {json_with_int_id, bson_with_int_id},
      {json_with_subdoc_id, bson_with_subdoc_id},
      {json_with_metadata, bson_with_metadata},
   };

   int n_tests = sizeof (tests) / sizeof (dbref_test_t);
   int i;

   for (i = 0; i < n_tests; i++) {
      r = bson_init_from_json (&b, tests[i].json, -1, &error);
      if (!r) {
         fprintf (stderr, "%s\n", error.message);
      }

      BSON_ASSERT (r);
      bson_eq_bson (&b, tests[i].expected_bson);
      bson_destroy (&b);
   }

   for (i = 0; i < n_tests; i++) {
      bson_destroy (tests[i].expected_bson);
   }
}